

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es.c
# Opt level: O0

int esUsage(void)

{
  printf("bee2cmd/%s: %s\nUsage:\n  es print\n    list available entropy sources and determine their health\n  es read <source> <count> <file>\n    read <count> Kbytes from <source> and store them in <file>\n  <source> in {trng, trng2, sys, sys2, timer, timerNN}\n    timerNNN -- use NNN sleep delays to produce one output bit\n"
         ,"es","monitor entropy sources");
  return -1;
}

Assistant:

static int esUsage()
{
	printf(
		"bee2cmd/%s: %s\n"
		"Usage:\n"
		"  es print\n"
		"    list available entropy sources and determine their health\n"
		"  es read <source> <count> <file>\n"
		"    read <count> Kbytes from <source> and store them in <file>\n"
		"  <source> in {trng, trng2, sys, sys2, timer, timerNN}\n"
		"    timerNNN -- use NNN sleep delays to produce one output bit\n"
		,
		_name, _descr
	);
	return -1;
}